

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

void __thiscall
QFragmentMapData<QTextFragmentData>::rotateRight(QFragmentMapData<QTextFragmentData> *this,uint x)

{
  quint32 *pqVar1;
  uint uVar2;
  uint uVar3;
  QTextFragmentData *pQVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Header *pHVar8;
  Header *pHVar9;
  ulong uVar10;
  
  pHVar8 = (this->field_0).head;
  lVar5 = (ulong)x * 0x20;
  uVar2 = *(uint *)((long)pHVar8 + lVar5);
  uVar3 = *(uint *)((long)pHVar8 + lVar5 + 4);
  uVar6 = (ulong)uVar3;
  if (uVar6 == 0) {
    *(undefined4 *)((long)pHVar8 + lVar5 + 4) = 0;
  }
  else {
    lVar7 = uVar6 * 0x20;
    *(undefined4 *)((long)pHVar8 + lVar5 + 4) = *(undefined4 *)((long)pHVar8 + lVar7 + 8);
    uVar10 = (ulong)*(uint *)((long)(this->field_0).head + lVar7 + 8);
    if (uVar10 != 0) {
      *(uint *)((long)(this->field_0).head + uVar10 * 0x20) = x;
    }
    *(uint *)((long)(this->field_0).head + lVar7 + 8) = x;
    *(uint *)((long)(this->field_0).head + lVar7) = uVar2;
  }
  pHVar8 = (this->field_0).head;
  if (uVar2 != 0) {
    pHVar9 = (Header *)((long)pHVar8 + (ulong)uVar2 * 0x20 + 8);
    pHVar8 = (Header *)((long)pHVar8 + (ulong)uVar2 * 0x20 + 4);
    if (pHVar9->root == x) {
      pHVar8 = pHVar9;
    }
  }
  pHVar8->root = uVar3;
  *(uint *)((long)(this->field_0).head + lVar5) = uVar3;
  pQVar4 = (this->field_0).fragments;
  pqVar1 = pQVar4[x].super_QFragment<1>.size_left_array;
  *pqVar1 = *pqVar1 - (pQVar4[uVar6].super_QFragment<1>.size_array[0] +
                      pQVar4[uVar6].super_QFragment<1>.size_left_array[0]);
  return;
}

Assistant:

inline Fragment &F(uint index) { return fragments[index] ; }